

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int ncnn::setup_thread_affinity_masks(void)

{
  int iVar1;
  CpuSet *this;
  reference pvVar2;
  int i_1;
  int max_freq_khz_medium;
  int max_freq_khz;
  int i;
  vector<int,_std::allocator<int>_> cpu_max_freq_khz;
  int max_freq_khz_max;
  int max_freq_khz_min;
  int in_stack_000000c0;
  CpuSet *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar3;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffc4;
  vector<int,_std::allocator<int>_> local_28;
  int local_c;
  int local_8;
  int local_4;
  
  CpuSet::disable_all(in_stack_ffffffffffffffa0);
  local_8 = 0x7fffffff;
  local_c = 0;
  this = (CpuSet *)(long)g_cpucount;
  std::allocator<int>::allocator((allocator<int> *)0x96625b);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             (allocator_type *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  std::allocator<int>::~allocator((allocator<int> *)0x96627b);
  for (iVar4 = 0; iVar4 < g_cpucount; iVar4 = iVar4 + 1) {
    iVar1 = get_max_freq_khz(in_stack_000000c0);
    iVar3 = iVar1;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,(long)iVar4);
    *pvVar2 = iVar1;
    if (local_c < iVar3) {
      local_c = iVar3;
    }
    if (iVar3 < local_8) {
      local_8 = iVar3;
    }
  }
  iVar4 = (local_8 + local_c) / 2;
  if (iVar4 == local_c) {
    CpuSet::disable_all(this);
    memcpy(g_thread_affinity_mask_big,g_thread_affinity_mask_all,0x80);
  }
  else {
    for (in_stack_ffffffffffffffb0 = 0; in_stack_ffffffffffffffb0 < g_cpucount;
        in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb0 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&local_28,(long)in_stack_ffffffffffffffb0);
      if (*pvVar2 < iVar4) {
        CpuSet::enable((CpuSet *)g_thread_affinity_mask_little,in_stack_ffffffffffffffb0);
      }
      else {
        CpuSet::enable((CpuSet *)g_thread_affinity_mask_big,in_stack_ffffffffffffffb0);
      }
    }
  }
  local_4 = 0;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(1,in_stack_ffffffffffffffb0));
  return local_4;
}

Assistant:

static int setup_thread_affinity_masks()
{
    g_thread_affinity_mask_all.disable_all();

#if defined __ANDROID__ || defined __linux__
    int max_freq_khz_min = INT_MAX;
    int max_freq_khz_max = 0;
    std::vector<int> cpu_max_freq_khz(g_cpucount);
    for (int i = 0; i < g_cpucount; i++)
    {
        int max_freq_khz = get_max_freq_khz(i);

        //         NCNN_LOGE("%d max freq = %d khz", i, max_freq_khz);

        cpu_max_freq_khz[i] = max_freq_khz;

        if (max_freq_khz > max_freq_khz_max)
            max_freq_khz_max = max_freq_khz;
        if (max_freq_khz < max_freq_khz_min)
            max_freq_khz_min = max_freq_khz;
    }

    int max_freq_khz_medium = (max_freq_khz_min + max_freq_khz_max) / 2;
    if (max_freq_khz_medium == max_freq_khz_max)
    {
        g_thread_affinity_mask_little.disable_all();
        g_thread_affinity_mask_big = g_thread_affinity_mask_all;
        return 0;
    }

    for (int i = 0; i < g_cpucount; i++)
    {
        if (cpu_max_freq_khz[i] < max_freq_khz_medium)
            g_thread_affinity_mask_little.enable(i);
        else
            g_thread_affinity_mask_big.enable(i);
    }
#elif __APPLE__
    // affinity info from cpu model
    if (g_hw_cpufamily == CPUFAMILY_ARM_MONSOON_MISTRAL)
    {
        // 2 + 4
        g_thread_affinity_mask_big.enable(0);
        g_thread_affinity_mask_big.enable(1);
        g_thread_affinity_mask_little.enable(2);
        g_thread_affinity_mask_little.enable(3);
        g_thread_affinity_mask_little.enable(4);
        g_thread_affinity_mask_little.enable(5);
    }
    else if (g_hw_cpufamily == CPUFAMILY_ARM_VORTEX_TEMPEST || g_hw_cpufamily == CPUFAMILY_ARM_LIGHTNING_THUNDER || g_hw_cpufamily == CPUFAMILY_ARM_FIRESTORM_ICESTORM || g_hw_cpufamily == CPUFAMILY_ARM_AVALANCHE_BLIZZARD)
    {
        // 2 + 4 or 4 + 4
        if (get_cpu_count() == 6)
        {
            g_thread_affinity_mask_big.enable(0);
            g_thread_affinity_mask_big.enable(1);
            g_thread_affinity_mask_little.enable(2);
            g_thread_affinity_mask_little.enable(3);
            g_thread_affinity_mask_little.enable(4);
            g_thread_affinity_mask_little.enable(5);
        }
        else
        {
            g_thread_affinity_mask_big.enable(0);
            g_thread_affinity_mask_big.enable(1);
            g_thread_affinity_mask_big.enable(2);
            g_thread_affinity_mask_big.enable(3);
            g_thread_affinity_mask_little.enable(4);
            g_thread_affinity_mask_little.enable(5);
            g_thread_affinity_mask_little.enable(6);
            g_thread_affinity_mask_little.enable(7);
        }
    }
    else
    {
        // smp models
        g_thread_affinity_mask_little.disable_all();
        g_thread_affinity_mask_big = g_thread_affinity_mask_all;
    }
#else
    // TODO implement me for other platforms
    g_thread_affinity_mask_little.disable_all();
    g_thread_affinity_mask_big = g_thread_affinity_mask_all;
#endif

    return 0;
}